

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool __thiscall flatbuffers::EnumDef::Deserialize(EnumDef *this,Parser *parser,Enum *_enum)

{
  bool bVar1;
  String *this_00;
  Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *pVVar2;
  EnumVal *this_01;
  return_type val;
  Type *type;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  uint i;
  string local_70;
  string local_50;
  
  this_00 = reflection::Enum::name(_enum);
  String::str_abi_cxx11_(&local_70,this_00);
  Parser::UnqualifiedName(&local_50,parser,&local_70);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  i = 0;
  do {
    pVVar2 = reflection::Enum::values(_enum);
    if (*(uint *)pVVar2 <= i) {
      bVar1 = reflection::Enum::is_union(_enum);
      this->is_union = bVar1;
      type = reflection::Enum::underlying_type(_enum);
      bVar1 = Type::Deserialize(&this->underlying_type,parser,type);
      if (!bVar1) {
        return false;
      }
      attrs = reflection::Enum::attributes(_enum);
      bVar1 = DeserializeAttributesCommon(&(this->super_Definition).attributes,parser,attrs);
      if (!bVar1) {
        return false;
      }
      documentation = reflection::Enum::documentation(_enum);
      anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
      return true;
    }
    this_01 = (EnumVal *)operator_new(0xa8);
    EnumVal::EnumVal(this_01);
    pVVar2 = reflection::Enum::values(_enum);
    val = Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>::Get(pVVar2,i);
    bVar1 = EnumVal::Deserialize(this_01,parser,val);
    if (!bVar1) break;
    bVar1 = SymbolTable<flatbuffers::EnumVal>::Add(&this->vals,(string *)this_01,this_01);
    i = i + 1;
  } while (!bVar1);
  EnumVal::~EnumVal(this_01);
  operator_delete(this_01,0xa8);
  return false;
}

Assistant:

bool EnumDef::Deserialize(Parser &parser, const reflection::Enum *_enum) {
  name = parser.UnqualifiedName(_enum->name()->str());
  for (uoffset_t i = 0; i < _enum->values()->size(); ++i) {
    auto val = new EnumVal();
    if (!val->Deserialize(parser, _enum->values()->Get(i)) ||
        vals.Add(val->name, val)) {
      delete val;
      return false;
    }
  }
  is_union = _enum->is_union();
  if (!underlying_type.Deserialize(parser, _enum->underlying_type())) {
    return false;
  }
  if (!DeserializeAttributes(parser, _enum->attributes())) return false;
  DeserializeDoc(doc_comment, _enum->documentation());
  return true;
}